

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O1

void __thiscall trento::Deuteron::sample_nucleons_impl(Deuteron *this)

{
  pointer pNVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 extraout_var [56];
  
  do {
    dVar4 = std::
            generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                      ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                        *)&random::engine);
    dVar5 = log(dVar4);
    dVar6 = this->a_;
    dVar11 = -dVar5 / (dVar6 + dVar6);
    dVar6 = exp(dVar11 * -dVar6);
    dVar5 = exp(-this->b_ * dVar11);
    dVar7 = std::
            generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                      ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                        *)&random::engine);
  } while (((dVar6 - dVar5) * (dVar6 - dVar5)) / dVar4 < dVar7);
  auVar8._0_8_ = std::
                 generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                           ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                             *)&random::engine);
  auVar8._8_56_ = extraout_var;
  auVar3 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar8._0_16_,ZEXT816(0xbff0000000000000));
  auVar9._0_8_ = auVar3._0_8_;
  dVar6 = std::
          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                    ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                      *)&random::engine);
  auVar9._8_8_ = 0;
  auVar3 = vfnmadd231sd_fma(ZEXT816(0x3ff0000000000000),auVar9,auVar9);
  if (auVar3._0_8_ < 0.0) {
    dVar4 = sqrt(auVar3._0_8_);
  }
  else {
    auVar3 = vsqrtsd_avx(auVar3,auVar3);
    dVar4 = auVar3._0_8_;
  }
  dVar5 = cos(dVar6 * 6.283185307179586);
  dVar5 = dVar5 * dVar11 * dVar4;
  dVar7 = sin(dVar6 * 6.283185307179586);
  dVar7 = dVar7 * dVar11 * dVar4;
  pNVar1 = (this->super_Nucleus).nucleons_.
           super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar6 = (this->super_Nucleus).offset_;
  pNVar1->x_ = dVar5 + dVar6;
  pNVar1->y_ = dVar7;
  pNVar1->z_ = dVar11 * auVar9._0_8_;
  pNVar1->is_participant_ = false;
  pNVar1->constituents_exist_ = false;
  pNVar1[1].x_ = dVar6 - dVar5;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar7;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar11 * auVar9._0_8_;
  auVar3 = vunpcklpd_avx(auVar3,auVar10);
  auVar2._8_8_ = 0x8000000000000000;
  auVar2._0_8_ = 0x8000000000000000;
  auVar3 = vxorpd_avx512vl(auVar3,auVar2);
  pNVar1[1].y_ = (double)auVar3._0_8_;
  pNVar1[1].z_ = (double)auVar3._8_8_;
  pNVar1[1].is_participant_ = false;
  pNVar1[1].constituents_exist_ = false;
  return;
}

Assistant:

void Deuteron::sample_nucleons_impl() {
  // Sample the inter-nucleon radius using rejection sampling with an envelope
  // function.  The Hulthén wavefunction including the r^2 Jacobian expands to
  // three exponential terms:  exp(-2*a*r) + exp(-2*b*r) - 2*exp(-(a+b)*r).
  // This does not have a closed-form inverse CDF, however we can easily sample
  // exponential numbers from the term that falls off the slowest, i.e.
  // exp(-2*min(a,b)*r).  In the ctor initializer list the "a" parameter is
  // always set to the minimum, so we should sample from exp(-2*a*r).
  double r, prob;
  do {
    // Sample a uniform random number, u = exp(-2*a*r).
    auto u = random::canonical<double>();
    // Invert to find the actual radius.
    r = -std::log(u) / (2*a_);
    // The acceptance probability is now the radial wavefunction over the
    // envelope function, both evaluated at the proposal radius r.
    // Conveniently, the envelope evaluated at r is just the uniform random
    // number u.
    prob = std::pow(std::exp(-a_*r) - std::exp(-b_*r), 2) / u;
  } while (prob < random::canonical<double>());

  // Now sample spherical rotation angles.
  auto cos_theta = random::cos_theta<double>();
  auto phi = random::phi<double>();

  // And compute the Cartesian coordinates of one nucleon.
  auto r_sin_theta = r * std::sqrt(1. - cos_theta*cos_theta);
  auto x = r_sin_theta * std::cos(phi);
  auto y = r_sin_theta * std::sin(phi);
  auto z = r * cos_theta;

  // Place the first nucleon at the sampled coordinates.
  set_nucleon_position(*begin(), x, y, z);
  // Place the second nucleon opposite to the first.
  set_nucleon_position(*std::next(begin()), -x, -y, -z);
}